

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TokenBuffer.cpp
# Opt level: O0

void __thiscall TokenBuffer::syncConsume(TokenBuffer *this)

{
  long in_RDI;
  CircularQueue<RefCount<Token>_> *unaff_retaddr;
  
  while (0 < *(int *)(in_RDI + 0x10)) {
    if (*(int *)(in_RDI + 8) < 1) {
      CircularQueue<RefCount<Token>_>::removeFirst(unaff_retaddr);
    }
    else {
      *(int *)(in_RDI + 0xc) = *(int *)(in_RDI + 0xc) + 1;
    }
    *(int *)(in_RDI + 0x10) = *(int *)(in_RDI + 0x10) + -1;
  }
  return;
}

Assistant:

void TokenBuffer::syncConsume()
{
	while (numToConsume > 0) {
		if (nMarkers > 0) {
			// guess mode -- leave leading tokens and bump offset.
			markerOffset++;
		} else {
			// normal mode -- remove first token
			queue.removeFirst();
		}
		numToConsume--;
	}
}